

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

void __thiscall i2p::sam::Session::~Session(Session *this)

{
  Mutex *this_00;
  long in_FS_OFFSET;
  AnnotatedMixin<std::mutex> *unaff_retaddr;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_00000008;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  Proxy *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffeb;
  int in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  Session *this_01;
  
  this_01 = *(Session **)(in_FS_OFFSET + 0x28);
  this_00 = MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffffc8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_00000008,unaff_retaddr,(char *)this_01,in_stack_fffffffffffffff0,
             in_stack_ffffffffffffffec,(bool)in_stack_ffffffffffffffeb);
  Disconnect(this_01);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffc8);
  CService::~CService(&in_stack_ffffffffffffffc8->proxy);
  std::unique_ptr<Sock,_std::default_delete<Sock>_>::~unique_ptr
            ((unique_ptr<Sock,_std::default_delete<Sock>_> *)this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_ffffffffffffffc8);
  Proxy::~Proxy(in_stack_ffffffffffffffc8);
  fs::path::~path((path *)in_stack_ffffffffffffffc8);
  if (*(Session **)(in_FS_OFFSET + 0x28) == this_01) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Session::~Session()
{
    LOCK(m_mutex);
    Disconnect();
}